

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

void __thiscall
Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
          (SparseMatrix<double,1,int> *this,SparseMatrix<double,_1,_int> *other)

{
  SparseMatrix<double,_1,_int>::resize
            ((SparseMatrix<double,_1,_int> *)this,other->m_outerSize,other->m_innerSize);
  if (*(void **)(this + 0x20) != (void *)0x0) {
    free(*(void **)(this + 0x20));
    *(undefined8 *)(this + 0x20) = 0;
  }
  return;
}

Assistant:

void initAssignment(const Other& other)
    {
      resize(other.rows(), other.cols());
      if(m_innerNonZeros)
      {
        std::free(m_innerNonZeros);
        m_innerNonZeros = 0;
      }
    }